

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O3

string * vkt::image::anon_unknown_0::getCoordStr
                   (string *__return_storage_ptr__,ImageType imageType,string *x,string *y,string *z
                   )

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  long *plVar4;
  string *psVar5;
  size_type *psVar6;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (IMAGE_TYPE_BUFFER < imageType) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return extraout_RAX_00;
  }
  if ((0x78U >> (imageType & 0x1f) & 1) == 0) {
    if ((6U >> (imageType & 0x1f) & 1) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (x->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + x->_M_string_length);
      return extraout_RAX;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "ivec2(",x);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_88);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_b8 = *plVar4;
      lStack_b0 = plVar3[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar4;
      local_c8 = (long *)*plVar3;
    }
    local_c0 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(y->_M_dataplus)._M_p)
    ;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_98 = *plVar4;
      lStack_90 = plVar3[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar4;
      local_a8 = (long *)*plVar3;
    }
    local_a0 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    local_48.field_2._M_allocated_capacity = local_88._16_8_;
    local_48._M_dataplus._M_p = (pointer)local_88._0_8_;
    if ((string *)local_88._0_8_ == (string *)(local_88 + 0x10)) {
      return (string *)(local_88 + 0x10);
    }
  }
  else {
    std::operator+(&local_48,"ivec3(",x);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar3[3];
      local_68._M_allocated_capacity = (size_type)&local_58;
    }
    else {
      local_58 = *plVar4;
      local_68._M_allocated_capacity = (size_type)(long *)*plVar3;
    }
    local_68._8_8_ = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               (local_68._M_local_buf,(ulong)(y->_M_dataplus)._M_p);
    psVar5 = (string *)(plVar3 + 2);
    if ((string *)*plVar3 == psVar5) {
      local_88._16_8_ = (psVar5->_M_dataplus)._M_p;
      local_88._24_8_ = plVar3[3];
      local_88._0_8_ = (string *)(local_88 + 0x10);
    }
    else {
      local_88._16_8_ = (psVar5->_M_dataplus)._M_p;
      local_88._0_8_ = (string *)*plVar3;
    }
    local_88._8_8_ = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_88);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_b8 = *plVar4;
      lStack_b0 = plVar3[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar4;
      local_c8 = (long *)*plVar3;
    }
    local_c0 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(z->_M_dataplus)._M_p)
    ;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_98 = *plVar4;
      lStack_90 = plVar3[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar4;
      local_a8 = (long *)*plVar3;
    }
    local_a0 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
    }
    if ((long *)local_68._M_allocated_capacity != &local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return (string *)&local_48.field_2;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1));
  return extraout_RAX_01;
}

Assistant:

static string getCoordStr (const ImageType		imageType,
						   const std::string&	x,
						   const std::string&	y,
						   const std::string&	z)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return x;
		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_2D:
			return string("ivec2(" + x + "," + y + ")");
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_3D:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return string("ivec3(" + x + "," + y + "," + z + ")");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}